

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  GCobj *pGVar1;
  char *pcVar2;
  ulong uVar3;
  
  if ((o->field_2).it == 0xfffffff7) {
    pGVar1 = (GCobj *)(ulong)(o->u32).lo;
    if ((pGVar1->gch).unused1 == '\0') {
      uVar3 = (ulong)(pGVar1->gch).metatable.gcptr32;
      if (idx < *(byte *)(uVar3 - 0x1c)) {
        pGVar1 = (GCobj *)(ulong)*(uint *)((long)pGVar1 + (ulong)idx * 4 + 0x14);
        *tvp = (TValue *)(ulong)(pGVar1->gch).metatable.gcptr32;
        *op = pGVar1;
        pcVar2 = lj_debug_uvname((GCproto *)(uVar3 - 0x40),idx);
        return pcVar2;
      }
    }
    else if (idx < (pGVar1->gch).unused2) {
      *tvp = (TValue *)((long)pGVar1 + (ulong)idx * 8 + 0x20);
      *op = pGVar1;
      return "";
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}